

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest13::iterate(FunctionalTest13 *this)

{
  ostringstream *this_00;
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  deUint32 dVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_var;
  ulong uVar16;
  ostream *poVar17;
  MessageBuilder *pMVar18;
  TestError *pTVar19;
  NotSupportedError *pNVar20;
  uint n_tc_subroutine;
  char *description;
  uint n_gs_subroutine;
  uint n_tc_id;
  uint n_te_id;
  uint n_gs_id;
  int n_subroutine_permutation;
  uint uVar21;
  long lVar22;
  GLint validate_status;
  ulong local_9c0;
  GLuint vs_subroutine_indices [2];
  GLuint te_subroutine_indices [2];
  GLuint tc_subroutine_indices [2];
  GLuint gs_subroutine_indices [2];
  GLuint fs_subroutine_indices [2];
  undefined8 local_960;
  stringstream fs_subroutine_name_sstream;
  GLuint GStack_954;
  _func_int **local_950;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_948;
  undefined4 local_938;
  GLuint local_934;
  GLuint *local_930;
  undefined4 local_928;
  GLuint local_924;
  GLuint *local_920;
  undefined4 local_918;
  GLuint local_914;
  GLuint *local_910;
  undefined1 local_7d0 [384];
  stringstream gs_subroutine_name_sstream;
  ostream local_640;
  stringstream vs_subroutine_name_sstream;
  ostream local_4b8;
  stringstream te_subroutine_name_sstream;
  ostream local_330;
  stringstream tc_subroutine_name_sstream;
  ostream local_1a8;
  undefined8 *puVar15;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar15 = (undefined8 *)CONCAT44(extraout_var,iVar8);
  bVar7 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar7) {
    pNVar20 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fs_subroutine_name_sstream,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)&gs_subroutine_name_sstream);
    tcu::NotSupportedError::NotSupportedError(pNVar20,(string *)&fs_subroutine_name_sstream);
    __cxa_throw(pNVar20,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar7 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_separate_shader_objects");
  if (!bVar7) {
    pNVar20 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fs_subroutine_name_sstream,
               "GL_ARB_separate_shader_objects is not supported",
               (allocator<char> *)&gs_subroutine_name_sstream);
    tcu::NotSupportedError::NotSupportedError(pNVar20,(string *)&fs_subroutine_name_sstream);
    __cxa_throw(pNVar20,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  uVar16 = 0;
  do {
    uVar9 = (uint)uVar16;
    if (uVar9 == 0x20) {
      bVar7 = this->m_has_test_passed == false;
      if (bVar7) {
        description = "Fail";
      }
      else {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar7,
                 description);
      return STOP;
    }
    n_gs_id = (uint)(uVar16 >> 1) & 1;
    n_tc_id = (uint)(uVar16 >> 2) & 1;
    n_te_id = (uint)(uVar16 >> 3) & 1;
    GVar1 = this->m_fs_po_ids[uVar9 & 1];
    GVar2 = this->m_gs_po_ids[n_gs_id];
    GVar3 = this->m_tc_po_ids[n_tc_id];
    GVar4 = this->m_te_po_ids[n_te_id];
    GVar5 = this->m_vs_po_ids[0xf < uVar9];
    (*(code *)puVar15[0x2d1])(this->m_pipeline_id,2);
    dVar10 = (*(code *)puVar15[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_FRAGMENT_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bf7);
    (*(code *)puVar15[0x2d1])(this->m_pipeline_id,4,GVar2);
    dVar10 = (*(code *)puVar15[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_GEOMETRY_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bfb);
    (*(code *)puVar15[0x2d1])(this->m_pipeline_id,8,GVar3);
    dVar10 = (*(code *)puVar15[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_TESS_CONTROL_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bff);
    (*(code *)puVar15[0x2d1])(this->m_pipeline_id,0x10,GVar4);
    dVar10 = (*(code *)puVar15[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_TESS_EVALUATION_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c03);
    (*(code *)puVar15[0x2d1])(this->m_pipeline_id,1,GVar5);
    dVar10 = (*(code *)puVar15[0x100])();
    glu::checkError(dVar10,"glUseProgramStages() call failed for GL_VERTEX_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c07);
    validate_status = 0;
    (*(code *)puVar15[0x2d3])(this->m_pipeline_id);
    dVar10 = (*(code *)puVar15[0x100])();
    glu::checkError(dVar10,"glValidateProgramPipeline() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c0d);
    (*(code *)puVar15[0x134])(this->m_pipeline_id,0x8b83,&validate_status);
    dVar10 = (*(code *)puVar15[0x100])();
    glu::checkError(dVar10,"glGetProgramPipelineiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c10);
    if (validate_status != 1) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,"Program pipeline has not been validated successfully.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x1c14);
LAB_00a1b898:
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    fs_subroutine_indices[0] = 0xffffffff;
    fs_subroutine_indices[1] = 0;
    gs_subroutine_indices[0] = 0xffffffff;
    gs_subroutine_indices[1] = 0;
    tc_subroutine_indices[0] = 0xffffffff;
    tc_subroutine_indices[1] = 0;
    te_subroutine_indices[0] = 0xffffffff;
    te_subroutine_indices[1] = 0;
    vs_subroutine_indices[0] = 0xffffffff;
    vs_subroutine_indices[1] = 0;
    for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 4) {
      std::__cxx11::stringstream::stringstream((stringstream *)&fs_subroutine_name_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)&gs_subroutine_name_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)&tc_subroutine_name_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)&te_subroutine_name_sstream);
      std::__cxx11::stringstream::stringstream((stringstream *)&vs_subroutine_name_sstream);
      poVar17 = std::operator<<((ostream *)&local_948,"SubroutineFS");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      poVar17 = std::operator<<(&local_640,"SubroutineGS");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      poVar17 = std::operator<<(&local_1a8,"SubroutineTC");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      poVar17 = std::operator<<(&local_330,"SubroutineTE");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      poVar17 = std::operator<<(&local_4b8,"SubroutineVS");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      pcVar6 = (code *)puVar15[0x151];
      std::__cxx11::stringbuf::str();
      uVar11 = (*pcVar6)(GVar1,0x8b30,local_7d0._0_8_);
      *(undefined4 *)((long)fs_subroutine_indices + lVar22) = uVar11;
      std::__cxx11::string::~string((string *)local_7d0);
      pcVar6 = (code *)puVar15[0x151];
      std::__cxx11::stringbuf::str();
      uVar11 = (*pcVar6)(GVar2,0x8dd9,local_7d0._0_8_);
      *(undefined4 *)((long)gs_subroutine_indices + lVar22) = uVar11;
      std::__cxx11::string::~string((string *)local_7d0);
      pcVar6 = (code *)puVar15[0x151];
      std::__cxx11::stringbuf::str();
      uVar11 = (*pcVar6)(GVar3,0x8e88,local_7d0._0_8_);
      *(undefined4 *)((long)tc_subroutine_indices + lVar22) = uVar11;
      std::__cxx11::string::~string((string *)local_7d0);
      pcVar6 = (code *)puVar15[0x151];
      std::__cxx11::stringbuf::str();
      uVar11 = (*pcVar6)(GVar4,0x8e87,local_7d0._0_8_);
      *(undefined4 *)((long)te_subroutine_indices + lVar22) = uVar11;
      std::__cxx11::string::~string((string *)local_7d0);
      pcVar6 = (code *)puVar15[0x151];
      std::__cxx11::stringbuf::str();
      uVar11 = (*pcVar6)(GVar5,0x8b31,local_7d0._0_8_);
      *(undefined4 *)((long)vs_subroutine_indices + lVar22) = uVar11;
      std::__cxx11::string::~string((string *)local_7d0);
      dVar10 = (*(code *)puVar15[0x100])();
      glu::checkError(dVar10,"glGetSubroutineIndex() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c3b);
      if (((*(int *)((long)fs_subroutine_indices + lVar22) == -1) ||
          (*(int *)((long)gs_subroutine_indices + lVar22) == -1)) ||
         ((*(int *)((long)tc_subroutine_indices + lVar22) == -1 ||
          ((*(int *)((long)te_subroutine_indices + lVar22) == -1 ||
           (*(int *)((long)vs_subroutine_indices + lVar22) == -1)))))) {
        local_7d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_7d0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,
                        "At least one subroutine was not recognized by glGetSubroutineIndex() call. (fs:"
                       );
        pMVar18 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_7d0,
                             (uint *)((long)fs_subroutine_indices + lVar22));
        std::operator<<(&(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", gs:"
                       );
        pMVar18 = tcu::MessageBuilder::operator<<
                            (pMVar18,(uint *)((long)gs_subroutine_indices + lVar22));
        std::operator<<(&(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", tc:"
                       );
        pMVar18 = tcu::MessageBuilder::operator<<
                            (pMVar18,(uint *)((long)tc_subroutine_indices + lVar22));
        std::operator<<(&(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", te:"
                       );
        pMVar18 = tcu::MessageBuilder::operator<<
                            (pMVar18,(uint *)((long)te_subroutine_indices + lVar22));
        std::operator<<(&(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", vs:"
                       );
        pMVar18 = tcu::MessageBuilder::operator<<
                            (pMVar18,(uint *)((long)vs_subroutine_indices + lVar22));
        std::operator<<(&(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
        tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar19,"At least one subroutine was not recognized",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x1c4c);
        __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&vs_subroutine_name_sstream);
      std::__cxx11::stringstream::~stringstream((stringstream *)&te_subroutine_name_sstream);
      std::__cxx11::stringstream::~stringstream((stringstream *)&tc_subroutine_name_sstream);
      std::__cxx11::stringstream::~stringstream((stringstream *)&gs_subroutine_name_sstream);
      std::__cxx11::stringstream::~stringstream((stringstream *)&fs_subroutine_name_sstream);
    }
    iVar8 = (*(code *)puVar15[0x152])(GVar1,0x8b30,"function");
    iVar12 = (*(code *)puVar15[0x152])(GVar2,0x8dd9,"function");
    iVar13 = (*(code *)puVar15[0x152])(GVar3,0x8e88,"function");
    uVar11 = (*(code *)puVar15[0x152])(GVar4,0x8e87,"function");
    local_9c0 = CONCAT44(local_9c0._4_4_,uVar11);
    iVar14 = (*(code *)puVar15[0x152])(GVar5,0x8b31,"function");
    if ((((iVar8 == -1) || (iVar12 == -1)) || (iVar13 == -1)) ||
       (((int)local_9c0 == -1 || (iVar14 == -1)))) {
      _fs_subroutine_name_sstream =
           (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_950);
      std::operator<<((ostream *)&local_950,
                      "At least one subroutine uniform is considered inactive by glGetSubroutineUniformLocation (fs:"
                     );
      std::ostream::operator<<((ostringstream *)&local_950,iVar8);
      std::operator<<((ostream *)&local_950,", gs:");
      std::ostream::operator<<((ostringstream *)&local_950,iVar12);
      std::operator<<((ostream *)&local_950,", tc:");
      std::ostream::operator<<((ostringstream *)&local_950,iVar13);
      std::operator<<((ostream *)&local_950,", te:");
      std::ostream::operator<<((ostringstream *)&local_950,(int)local_9c0);
      std::operator<<((ostream *)&local_950,", vs:");
      std::ostream::operator<<((ostringstream *)&local_950,iVar14);
      std::operator<<((ostream *)&local_950,").");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&fs_subroutine_name_sstream,
                 (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_950);
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,"At least one subroutine uniform is considered inactive",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x1c61);
      goto LAB_00a1b898;
    }
    for (uVar21 = 0; uVar21 != 0x20; uVar21 = uVar21 + 1) {
      local_960 = (ulong)(uVar21 & 1);
      n_gs_subroutine = uVar21 >> 1 & 1;
      n_tc_subroutine = uVar21 >> 2 & 1;
      local_9c0 = (ulong)(uVar21 >> 3 & 1);
      GStack_954 = GVar1;
      _fs_subroutine_name_sstream = 0x8b30;
      local_950 = (_func_int **)(fs_subroutine_indices + local_960);
      local_948._M_allocated_capacity._0_4_ = 0x8dd9;
      local_948._M_allocated_capacity._4_4_ = GVar2;
      local_948._8_8_ = gs_subroutine_indices + n_gs_subroutine;
      local_938 = 0x8e88;
      local_934 = GVar3;
      local_930 = tc_subroutine_indices + n_tc_subroutine;
      local_928 = 0x8e87;
      local_924 = GVar4;
      local_920 = te_subroutine_indices + local_9c0;
      local_918 = 0x8b31;
      local_914 = GVar5;
      local_910 = vs_subroutine_indices + (0xf < uVar21);
      for (lVar22 = 8; lVar22 != 0x58; lVar22 = lVar22 + 0x10) {
        (*(code *)*puVar15)(this->m_pipeline_id,*(undefined4 *)((long)&local_960 + lVar22 + 4));
        dVar10 = (*(code *)puVar15[0x100])();
        glu::checkError(dVar10,"glActiveShaderProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x1c7f);
        (*(code *)puVar15[0x2cd])
                  (*(undefined4 *)((long)&local_960 + lVar22),1,
                   *(undefined8 *)(&fs_subroutine_name_sstream + lVar22));
        dVar10 = (*(code *)puVar15[0x100])();
        glu::checkError(dVar10,"glUniformSubroutinesuiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x1c82);
      }
      (*(code *)puVar15[0x31])(0x4000);
      dVar10 = (*(code *)puVar15[0x100])();
      glu::checkError(dVar10,"glClear() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c87);
      (*(code *)puVar15[0xa7])(0xe,0,1);
      dVar10 = (*(code *)puVar15[0x100])();
      glu::checkError(dVar10,"glDrawArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c8a);
      (*(code *)puVar15[0x244])
                (0,0,this->m_to_width,this->m_to_height,0x1908,0x1406,this->m_read_buffer);
      dVar10 = (*(code *)puVar15[0x100])();
      glu::checkError(dVar10,"glReadPixels() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c90);
      verifyReadBuffer(this,uVar9 & 1,(uint)local_960,n_gs_id,n_gs_subroutine,n_tc_id,
                       n_tc_subroutine,n_te_id,(uint)local_9c0,(uint)(0xf < uVar9),
                       (uint)(0xf < uVar21));
    }
    uVar16 = (ulong)(uVar9 + 1);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest13::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine and GL_ARB_separate_shader_objects
	 * are not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_separate_shader_objects"))
	{
		throw tcu::NotSupportedError("GL_ARB_separate_shader_objects is not supported");
	}

	/* Initialize all GL objects before we continue */
	initTest();

	/* Iterate over all possible FS/GS/TC/TE/VS permutations */
	for (int n_shader_permutation = 0; n_shader_permutation < 32 /* 2^5 */; ++n_shader_permutation)
	{
		const unsigned int n_fs_idx = ((n_shader_permutation & (1 << 0)) != 0) ? 1 : 0;
		const unsigned int n_gs_idx = ((n_shader_permutation & (1 << 1)) != 0) ? 1 : 0;
		const unsigned int n_tc_idx = ((n_shader_permutation & (1 << 2)) != 0) ? 1 : 0;
		const unsigned int n_te_idx = ((n_shader_permutation & (1 << 3)) != 0) ? 1 : 0;
		const unsigned int n_vs_idx = ((n_shader_permutation & (1 << 4)) != 0) ? 1 : 0;
		const unsigned int fs_po_id = m_fs_po_ids[n_fs_idx];
		const unsigned int gs_po_id = m_gs_po_ids[n_gs_idx];
		const unsigned int tc_po_id = m_tc_po_ids[n_tc_idx];
		const unsigned int te_po_id = m_te_po_ids[n_te_idx];
		const unsigned int vs_po_id = m_vs_po_ids[n_vs_idx];

		/* Configure fragment shader stage */
		gl.useProgramStages(m_pipeline_id, GL_FRAGMENT_SHADER_BIT, fs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_FRAGMENT_SHADER_BIT bit");

		/* Configure geometry shader stage */
		gl.useProgramStages(m_pipeline_id, GL_GEOMETRY_SHADER_BIT, gs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_GEOMETRY_SHADER_BIT bit");

		/* Configure tessellation control shader stage */
		gl.useProgramStages(m_pipeline_id, GL_TESS_CONTROL_SHADER_BIT, tc_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_TESS_CONTROL_SHADER_BIT bit");

		/* Configure tessellation evaluation shader stage */
		gl.useProgramStages(m_pipeline_id, GL_TESS_EVALUATION_SHADER_BIT, te_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_TESS_EVALUATION_SHADER_BIT bit");

		/* Configure vertex shader stage */
		gl.useProgramStages(m_pipeline_id, GL_VERTEX_SHADER_BIT, vs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_VERTEX_SHADER_BIT bit");

		/* Validate the pipeline */
		glw::GLint validate_status = GL_FALSE;

		gl.validateProgramPipeline(m_pipeline_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glValidateProgramPipeline() call failed.");

		gl.getProgramPipelineiv(m_pipeline_id, GL_VALIDATE_STATUS, &validate_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() call failed.");

		if (validate_status != GL_TRUE)
		{
			TCU_FAIL("Program pipeline has not been validated successfully.");
		}

		/* Retrieve subroutine indices */
		GLuint fs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  fs_subroutine_uniform_index = 0;
		GLuint gs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  gs_subroutine_uniform_index = 0;
		GLuint tc_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  tc_subroutine_uniform_index = 0;
		GLuint te_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  te_subroutine_uniform_index = 0;
		GLuint vs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  vs_subroutine_uniform_index = 0;

		for (unsigned int n_subroutine = 0; n_subroutine < 2; ++n_subroutine)
		{
			std::stringstream fs_subroutine_name_sstream;
			std::stringstream gs_subroutine_name_sstream;
			std::stringstream tc_subroutine_name_sstream;
			std::stringstream te_subroutine_name_sstream;
			std::stringstream vs_subroutine_name_sstream;

			fs_subroutine_name_sstream << "SubroutineFS" << (n_subroutine + 1);
			gs_subroutine_name_sstream << "SubroutineGS" << (n_subroutine + 1);
			tc_subroutine_name_sstream << "SubroutineTC" << (n_subroutine + 1);
			te_subroutine_name_sstream << "SubroutineTE" << (n_subroutine + 1);
			vs_subroutine_name_sstream << "SubroutineVS" << (n_subroutine + 1);

			fs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(fs_po_id, GL_FRAGMENT_SHADER, fs_subroutine_name_sstream.str().c_str());
			gs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(gs_po_id, GL_GEOMETRY_SHADER, gs_subroutine_name_sstream.str().c_str());
			tc_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(tc_po_id, GL_TESS_CONTROL_SHADER, tc_subroutine_name_sstream.str().c_str());
			te_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(te_po_id, GL_TESS_EVALUATION_SHADER, te_subroutine_name_sstream.str().c_str());
			vs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(vs_po_id, GL_VERTEX_SHADER, vs_subroutine_name_sstream.str().c_str());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed.");

			if (fs_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				gs_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				tc_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				te_subroutine_indices[n_subroutine] == (GLuint)-1 || vs_subroutine_indices[n_subroutine] == (GLuint)-1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "At least one subroutine was not recognized by glGetSubroutineIndex() call. "
									  "(fs:"
								   << fs_subroutine_indices[n_subroutine]
								   << ", gs:" << gs_subroutine_indices[n_subroutine]
								   << ", tc:" << tc_subroutine_indices[n_subroutine]
								   << ", te:" << te_subroutine_indices[n_subroutine]
								   << ", vs:" << vs_subroutine_indices[n_subroutine] << ")."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("At least one subroutine was not recognized");
			}
		} /* for (both subroutines) */

		/* Retrieve subroutine uniform indices */
		fs_subroutine_uniform_index = gl.getSubroutineUniformLocation(fs_po_id, GL_FRAGMENT_SHADER, "function");
		gs_subroutine_uniform_index = gl.getSubroutineUniformLocation(gs_po_id, GL_GEOMETRY_SHADER, "function");
		tc_subroutine_uniform_index = gl.getSubroutineUniformLocation(tc_po_id, GL_TESS_CONTROL_SHADER, "function");
		te_subroutine_uniform_index = gl.getSubroutineUniformLocation(te_po_id, GL_TESS_EVALUATION_SHADER, "function");
		vs_subroutine_uniform_index = gl.getSubroutineUniformLocation(vs_po_id, GL_VERTEX_SHADER, "function");

		if (fs_subroutine_uniform_index == -1 || gs_subroutine_uniform_index == -1 ||
			tc_subroutine_uniform_index == -1 || te_subroutine_uniform_index == -1 || vs_subroutine_uniform_index == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "At least one subroutine uniform is considered inactive by "
														   "glGetSubroutineUniformLocation ("
														   "fs:"
							   << fs_subroutine_uniform_index << ", gs:" << gs_subroutine_uniform_index
							   << ", tc:" << tc_subroutine_uniform_index << ", te:" << te_subroutine_uniform_index
							   << ", vs:" << vs_subroutine_uniform_index << ")." << tcu::TestLog::EndMessage;

			TCU_FAIL("At least one subroutine uniform is considered inactive");
		}

		/* Check if both subroutines work correctly in each stage */
		for (int n_subroutine_permutation = 0; n_subroutine_permutation < 32; /* 2^5 */
			 ++n_subroutine_permutation)
		{
			unsigned int n_fs_subroutine = ((n_subroutine_permutation & (1 << 0)) != 0) ? 1 : 0;
			unsigned int n_gs_subroutine = ((n_subroutine_permutation & (1 << 1)) != 0) ? 1 : 0;
			unsigned int n_tc_subroutine = ((n_subroutine_permutation & (1 << 2)) != 0) ? 1 : 0;
			unsigned int n_te_subroutine = ((n_subroutine_permutation & (1 << 3)) != 0) ? 1 : 0;
			unsigned int n_vs_subroutine = ((n_subroutine_permutation & (1 << 4)) != 0) ? 1 : 0;

			/* Configure subroutine uniforms */
			struct
			{
				glw::GLenum  stage;
				glw::GLuint  po_id;
				glw::GLuint* indices;
			} configurations[] = {
				{ GL_FRAGMENT_SHADER, fs_po_id, fs_subroutine_indices + n_fs_subroutine },
				{ GL_GEOMETRY_SHADER, gs_po_id, gs_subroutine_indices + n_gs_subroutine },
				{ GL_TESS_CONTROL_SHADER, tc_po_id, tc_subroutine_indices + n_tc_subroutine },
				{ GL_TESS_EVALUATION_SHADER, te_po_id, te_subroutine_indices + n_te_subroutine },
				{ GL_VERTEX_SHADER, vs_po_id, vs_subroutine_indices + n_vs_subroutine },
			};

			for (int i = 0; i < 5; ++i)
			{
				gl.activeShaderProgram(m_pipeline_id, configurations[i].po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveShaderProgram() call failed.");

				gl.uniformSubroutinesuiv(configurations[i].stage, 1 /* count */, configurations[i].indices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() call failed.");
			}

			/* Render a full-screen quad with the pipeline */
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

			gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

			/* Read color attachment's contents */
			gl.readPixels(0, /* x */
						  0, /* y */
						  m_to_width, m_to_height, GL_RGBA, GL_FLOAT, m_read_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

			/* Verify the contents */
			verifyReadBuffer(n_fs_idx, n_fs_subroutine, n_gs_idx, n_gs_subroutine, n_tc_idx, n_tc_subroutine, n_te_idx,
							 n_te_subroutine, n_vs_idx, n_vs_subroutine);
		} /* for (all subroutine permutations) */
	}	 /* for (all program shader object permutations) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}